

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessInfo.cc
# Opt level: O3

string * muduo::ProcessInfo::username_abi_cxx11_(void)

{
  __uid_t __uid;
  string *in_RDI;
  passwd *result;
  passwd pwd;
  char buf [8192];
  allocator local_2051;
  passwd *local_2050;
  passwd local_2048;
  char local_2018 [8200];
  
  local_2050 = (passwd *)0x0;
  __uid = getuid();
  getpwuid_r(__uid,&local_2048,local_2018,0x2000,&local_2050);
  if (local_2050 == (passwd *)0x0) {
    local_2048.pw_name = "unknownuser";
  }
  std::__cxx11::string::string((string *)in_RDI,local_2048.pw_name,&local_2051);
  return in_RDI;
}

Assistant:

string ProcessInfo::username()
{
  struct passwd pwd;
  struct passwd* result = NULL;
  char buf[8192];
  const char* name = "unknownuser";

  getpwuid_r(uid(), &pwd, buf, sizeof buf, &result);
  if (result)
  {
    name = pwd.pw_name;
  }
  return name;
}